

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

void __thiscall
just::test::assert_equal_container::
run<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
          (assert_equal_container *this,vector<char,_std::allocator<char>_> *a_,
          vector<char,_std::allocator<char>_> *b_)

{
  bool v_;
  const_iterator b1_;
  const_iterator e1_;
  const_iterator b2_;
  const_iterator e2_;
  string local_1e8;
  char *local_1c8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_1c0;
  char *local_1b8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_1b0;
  ostringstream local_198 [8];
  ostringstream s;
  vector<char,_std::allocator<char>_> *b__local;
  vector<char,_std::allocator<char>_> *a__local;
  assert_equal_container *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,"Expected: ");
  local_1b0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(a_);
  local_1b8 = (char *)std::vector<char,_std::allocator<char>_>::end(a_);
  show<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
            (local_1b0,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)local_1b8,
             (ostream *)local_198);
  std::operator<<((ostream *)local_198," == ");
  local_1c0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(b_);
  local_1c8 = (char *)std::vector<char,_std::allocator<char>_>::end(b_);
  show<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
            (local_1c0,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)local_1c8,
             (ostream *)local_198);
  std::__cxx11::ostringstream::str();
  b1_ = std::vector<char,_std::allocator<char>_>::begin(a_);
  e1_ = std::vector<char,_std::allocator<char>_>::end(a_);
  b2_ = std::vector<char,_std::allocator<char>_>::begin(b_);
  e2_ = std::vector<char,_std::allocator<char>_>::end(b_);
  v_ = equal<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                 ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                  b1_._M_current,
                  (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                  e1_._M_current,
                  (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                  b2_._M_current,
                  (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                  e2_._M_current);
  assert_msg::operator()(&this->_assert_msg,&local_1e8,v_);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void run(const A& a_, const B& b_) const
      {
        std::ostringstream s;
        s << "Expected: ";
        show(a_.begin(), a_.end(), s);
        s << " == ";
        show(b_.begin(), b_.end(), s);

        _assert_msg(
          s.str(),
          ::just::test::equal(a_.begin(), a_.end(), b_.begin(), b_.end())
        );
      }